

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

void __thiscall ChronoTest_Align_Test::TestBody(ChronoTest_Align_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  seconds s;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  char (*in_stack_fffffffffffffd38) [13];
  duration<long,std::ratio<1l,1l>> *pdVar5;
  char *in_stack_fffffffffffffd40;
  string *actual_expression;
  char *in_stack_fffffffffffffd48;
  int line;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined8 in_stack_fffffffffffffd58;
  Type TVar6;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffd60;
  duration<long,_std::ratio<1L,_1L>_> *args;
  char (*in_stack_fffffffffffffd68) [16];
  int *in_stack_fffffffffffffd78;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffd80;
  char (*in_stack_fffffffffffffd88) [6];
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  AssertHelper *in_stack_fffffffffffffdb0;
  AssertHelper *this_00;
  int local_204;
  duration<long,std::ratio<1l,1l>> local_200 [8];
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  int local_1b4;
  duration<long,std::ratio<1l,1l>> local_1b0 [8];
  duration<long,_std::ratio<1L,_1L>_> local_1a8 [4];
  AssertionResult local_188 [2];
  int local_164;
  duration<long,std::ratio<1l,1l>> local_160 [8];
  string local_158 [32];
  AssertionResult local_138 [2];
  string local_118 [32];
  AssertionResult local_f8 [2];
  AssertHelper local_d8 [4];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  string local_40 [32];
  AssertionResult local_20;
  undefined8 local_10;
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_10 = 0x2a;
  fmt::v5::format<char[5],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [5])in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (char (*) [6])in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string(local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    testing::AssertionResult::failure_message((AssertionResult *)0x10d99b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd60,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdb0,
               (Message *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10d9fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10da56);
  local_94 = 5;
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>,int>
            (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (char (*) [6])in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    testing::AssertionResult::failure_message((AssertionResult *)0x10db5b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd60,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdb0,
               (Message *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10dbbe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dc16);
  this_00 = local_d8;
  fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [6])in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (char (*) [6])in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string((string *)local_d8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    testing::AssertionResult::failure_message((AssertionResult *)0x10dd08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd60,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10dd65);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ddbd);
  fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [7])in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (char (*) [8])in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string(local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    testing::AssertionResult::failure_message((AssertionResult *)0x10dea3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd60,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10df00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10df58);
  local_164 = 0x3039;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_160,&local_164);
  fmt::v5::format<char[14],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [14])in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string(local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd68 =
         (char (*) [16])testing::AssertionResult::failure_message((AssertionResult *)0x10e060);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd60,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10e0bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e115);
  local_1b4 = 0x3039;
  pdVar5 = local_1b0;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(pdVar5,&local_1b4);
  TVar6 = (Type)((ulong)pdVar5 >> 0x20);
  args = local_1a8;
  fmt::v5::format<char[15],std::chrono::duration<long,std::ratio<1l,1l>>>
            ((char (*) [15])in_stack_fffffffffffffd68,args);
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  std::__cxx11::string::~string((string *)local_1a8);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)args);
    in_stack_fffffffffffffd48 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10e21d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd50),
               (int)((ulong)in_stack_fffffffffffffd48 >> 0x20),in_stack_fffffffffffffd40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10e27a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e2d2);
  local_204 = 0x3039;
  pdVar5 = local_200;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(pdVar5,&local_204);
  actual_expression = local_1f8;
  fmt::v5::format<char[16],std::chrono::duration<long,std::ratio<1l,1l>>>
            (in_stack_fffffffffffffd68,args);
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            (in_stack_fffffffffffffd48,(char *)actual_expression,(char (*) [13])pdVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
  line = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  std::__cxx11::string::~string(local_1f8);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)args);
    testing::AssertionResult::failure_message((AssertionResult *)0x10e3da);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd50),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffda8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffd30));
    testing::Message::~Message((Message *)0x10e435);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e48a);
  return;
}

Assistant:

TEST(ChronoTest, Align) {
  auto s = std::chrono::seconds(42);
  EXPECT_EQ("42s  ", fmt::format("{:5}", s));
  EXPECT_EQ("42s  ", fmt::format("{:{}}", s, 5));
  EXPECT_EQ("  42s", fmt::format("{:>5}", s));
  EXPECT_EQ("**42s**", fmt::format("{:*^7}", s));
  EXPECT_EQ("03:25:45    ",
            fmt::format("{:12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("    03:25:45",
            fmt::format("{:>12%H:%M:%S}", std::chrono::seconds(12345)));
  EXPECT_EQ("~~03:25:45~~",
            fmt::format("{:~^12%H:%M:%S}", std::chrono::seconds(12345)));

}